

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

void __thiscall crnlib::symbol_codec::put_bits(symbol_codec *this,uint bits,uint num_bits)

{
  uint *puVar1;
  uchar uVar2;
  uint uVar3;
  int iVar4;
  
  if (num_bits != 0) {
    iVar4 = this->m_bit_count - num_bits;
    this->m_bit_count = iVar4;
    this->m_bit_buf = this->m_bit_buf | bits << ((byte)iVar4 & 0x1f);
    this->m_total_bits_written = this->m_total_bits_written + num_bits;
    if (iVar4 < 0x19) {
      do {
        uVar2 = *(uchar *)((long)&this->m_bit_buf + 3);
        uVar3 = (this->m_output_buf).m_size;
        if ((this->m_output_buf).m_capacity <= uVar3) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_output_buf,uVar3 + 1,true,1,(object_mover)0x0,
                     false);
        }
        (this->m_output_buf).m_p[(this->m_output_buf).m_size] = uVar2;
        puVar1 = &(this->m_output_buf).m_size;
        *puVar1 = *puVar1 + 1;
        this->m_bit_buf = this->m_bit_buf << 8;
        iVar4 = this->m_bit_count;
        this->m_bit_count = iVar4 + 8;
      } while (iVar4 < 0x11);
    }
  }
  return;
}

Assistant:

void symbol_codec::put_bits(uint bits, uint num_bits) {
  CRNLIB_ASSERT(num_bits <= 25);
  CRNLIB_ASSERT(m_bit_count >= 25);

  if (!num_bits)
    return;

  m_bit_count -= num_bits;
  m_bit_buf |= (static_cast<bit_buf_t>(bits) << m_bit_count);

  m_total_bits_written += num_bits;

  while (m_bit_count <= (cBitBufSize - 8)) {
    m_output_buf.push_back(static_cast<uint8>(m_bit_buf >> (cBitBufSize - 8)));

    m_bit_buf <<= 8;
    m_bit_count += 8;
  }
}